

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<short,(unsigned_char)8>>(Thread *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar3 [16];
  short sVar8;
  short sVar9;
  ushort uVar10;
  undefined1 auVar4 [16];
  undefined1 auVar7 [16];
  Value VVar11;
  undefined1 auVar2 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  VVar11 = Pop(this);
  auVar4._0_2_ = -(ushort)(VVar11.field_0._0_2_ < 0);
  sVar8 = -(ushort)(VVar11.field_0._2_2_ < 0);
  sVar9 = -(ushort)(VVar11.field_0._4_2_ < 0);
  uVar10 = -(ushort)(VVar11.field_0._6_2_ < 0);
  auVar5._0_10_ = (unkuint10)uVar10 << 0x30;
  auVar6._0_12_ = ZEXT212(uVar10) << 0x30;
  auVar6._12_2_ = uVar10;
  auVar6._14_2_ = uVar10;
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._10_2_ = sVar9;
  auVar4._8_8_ = (undefined8)(CONCAT64(auVar5._10_6_,CONCAT22(sVar9,uVar10)) >> 0x10);
  auVar4._6_2_ = sVar8;
  auVar4._4_2_ = sVar8;
  auVar4._2_2_ = auVar4._0_2_;
  auVar3._0_2_ = -(ushort)(VVar11.field_0._8_2_ < 0);
  sVar8 = -(ushort)(VVar11.field_0._10_2_ < 0);
  sVar9 = -(ushort)(VVar11.field_0._12_2_ < 0);
  uVar10 = -(ushort)(VVar11.field_0._14_2_ < 0);
  auVar1._0_10_ = (unkuint10)uVar10 << 0x30;
  auVar2._0_12_ = ZEXT212(uVar10) << 0x30;
  auVar2._12_2_ = uVar10;
  auVar2._14_2_ = uVar10;
  auVar1._12_4_ = auVar2._12_4_;
  auVar1._10_2_ = sVar9;
  auVar3._8_8_ = (undefined8)(CONCAT64(auVar1._10_6_,CONCAT22(sVar9,uVar10)) >> 0x10);
  auVar3._6_2_ = sVar8;
  auVar3._4_2_ = sVar8;
  auVar3._2_2_ = auVar3._0_2_;
  auVar3 = auVar3 & _DAT_00200f00 | auVar4 & _DAT_00200ef0;
  auVar7._0_8_ = auVar3._8_8_;
  auVar7._8_4_ = auVar3._8_4_;
  auVar7._12_4_ = auVar3._12_4_;
  Push(this,(Value)ZEXT416(SUB164(auVar7 | auVar3,4) | SUB164(auVar7 | auVar3,0)));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}